

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

void MULTILABEL::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  substring *psVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  size_t i_1;
  undefined4 uStack_38;
  uint32_t n;
  
  _uStack_38 = in_RAX;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)v);
  lVar4 = (long)words->_end - (long)words->_begin >> 4;
  if (lVar4 != 0) {
    if (lVar4 != 1) {
      std::operator<<((ostream *)&std::cerr,"example with an odd label, what is ");
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < (ulong)((long)words->_end - (long)words->_begin >> 4);
          uVar5 = uVar5 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 *(char **)((long)&words->_begin->begin + lVar4));
        std::operator<<(poVar3," ");
        lVar4 = lVar4 + 0x10;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      return;
    }
    lVar4 = 0;
    tokenize<v_array<substring>>(',',*words->_begin,&p->parse_name,false);
    for (uVar5 = 0; psVar1 = (p->parse_name)._begin,
        uVar5 < (ulong)((long)(p->parse_name)._end - (long)psVar1 >> 4); uVar5 = uVar5 + 1) {
      **(undefined1 **)((long)&psVar1->end + lVar4) = 0;
      iVar2 = atoi(*(char **)((long)&((p->parse_name)._begin)->begin + lVar4));
      _uStack_38 = CONCAT44(iVar2,uStack_38);
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)v,&n);
      lVar4 = lVar4 + 0x10;
    }
  }
  return;
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  labels* ld = (labels*)v;

  ld->label_v.clear();
  switch (words.size())
  {
    case 0:
      break;
    case 1:
      tokenize(',', words[0], p->parse_name);

      for (size_t i = 0; i < p->parse_name.size(); i++)
      {
        *(p->parse_name[i].end) = '\0';
        uint32_t n = atoi(p->parse_name[i].begin);
        ld->label_v.push_back(n);
      }
      break;
    default:
      cerr << "example with an odd label, what is ";
      for (size_t i = 0; i < words.size(); i++) cerr << words[i].begin << " ";
      cerr << endl;
  }
}